

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNCuSu.cpp
# Opt level: O3

void __thiscall NaPNCuSum::action(NaPNCuSum *this)

{
  int iVar1;
  NaPetriNet *pNVar2;
  NaTimer *pNVar3;
  NaVector *pNVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  NaPetriCnOutput *this_00;
  double extraout_XMM0_Qa;
  NaReal NVar5;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar6;
  NaReal extraout_XMM0_Qa_02;
  NaReal NVar7;
  NaReal local_18;
  
  dVar6 = this->fStartTime;
  pNVar2 = NaPetriNode::net(&this->super_NaPetriNode);
  pNVar3 = NaPetriNet::timer(pNVar2);
  (*pNVar3->_vptr_NaTimer[4])(pNVar3);
  if (extraout_XMM0_Qa < dVar6) {
    pNVar4 = NaPetriCnOutput::data(&this->sum);
    iVar1 = (*pNVar4->_vptr_NaVector[8])(pNVar4,0);
    *(undefined8 *)CONCAT44(extraout_var,iVar1) = 0;
    this_00 = &this->d;
    local_18 = 0.0;
    goto LAB_001581d9;
  }
  NVar7 = this->fS;
  pNVar4 = NaPetriCnInput::data(&this->x);
  iVar1 = (*pNVar4->_vptr_NaVector[8])(pNVar4,0);
  NVar5 = imaging_point(this,NVar7,*(NaReal *)CONCAT44(extraout_var_00,iVar1));
  NVar7 = 0.0;
  if (0.0 <= NVar5) {
    NVar7 = NVar5;
  }
  this->fS = NVar7;
  this_00 = &this->sum;
  pNVar4 = NaPetriCnOutput::data(this_00);
  iVar1 = (*pNVar4->_vptr_NaVector[8])(pNVar4,0);
  *(NaReal *)CONCAT44(extraout_var_01,iVar1) = NVar7;
  if (this->fS < this->fTopVal || this->fS == this->fTopVal) {
    this_00 = &this->d;
    local_18 = 0.0;
    goto LAB_001581d9;
  }
  if (this->fATAD <= 0.0) {
    local_18 = 1.0;
LAB_001581a1:
    pNVar4 = NaPetriCnOutput::data(&this->d);
    iVar1 = (*pNVar4->_vptr_NaVector[8])(pNVar4,0);
    *(NaReal *)CONCAT44(extraout_var_02,iVar1) = local_18;
  }
  else {
    dVar6 = this->fPrevTA;
    pNVar2 = NaPetriNode::net(&this->super_NaPetriNode);
    pNVar3 = NaPetriNet::timer(pNVar2);
    (*pNVar3->_vptr_NaTimer[4])(pNVar3);
    if (dVar6 < 0.0) {
      local_18 = 0.0;
      dVar6 = extraout_XMM0_Qa_00;
LAB_00158199:
      this->fPrevTA = dVar6;
      goto LAB_001581a1;
    }
    if (extraout_XMM0_Qa_00 - this->fPrevTA <= this->fATAD) {
      local_18 = 1.0;
      dVar6 = -1.0;
      goto LAB_00158199;
    }
    local_18 = 0.0;
    pNVar2 = NaPetriNode::net(&this->super_NaPetriNode);
    pNVar3 = NaPetriNet::timer(pNVar2);
    (*pNVar3->_vptr_NaTimer[4])(pNVar3);
    dVar6 = extraout_XMM0_Qa_01 - this->fPrevTA;
    if (this->fATAD <= dVar6 && dVar6 != this->fATAD) {
      pNVar2 = NaPetriNode::net(&this->super_NaPetriNode);
      pNVar3 = NaPetriNet::timer(pNVar2);
      (*pNVar3->_vptr_NaTimer[4])(pNVar3);
      dVar6 = extraout_XMM0_Qa_02;
      goto LAB_00158199;
    }
  }
  this->fS = 0.0;
  local_18 = this->fTopVal;
LAB_001581d9:
  pNVar4 = NaPetriCnOutput::data(this_00);
  iVar1 = (*pNVar4->_vptr_NaVector[8])(pNVar4,0);
  *(NaReal *)CONCAT44(extraout_var_03,iVar1) = local_18;
  return;
}

Assistant:

void
NaPNCuSum::action ()
{
  if(fStartTime > net()->timer().CurrentTime())
    {
      // "turned-off" mode to wait for predefined moment
      sum.data()[0]  = 0.0;
      d.data()[0] = 0;
      return;
    }

  fS = imaging_point(fS, x.data()[0]);
  if(fS < 0.0)
    fS = 0.0;

  sum.data()[0]  = fS;
  /*
  NaPrintLog("'%s' -> check %g > %g (at %d) fATAD=%g\n",
	     name(), fS, fTopVal, net()->timer().CurrentIndex(), fATAD);
  */
  // compute detection signal here
  if(fS > fTopVal)
    {
      if(fATAD <= 0.0)
	{
	  /* unconditional alarm */
	  d.data()[0] = 1;
	  /*
	  NaPrintLog("'%s' -> unconditional alarm (at %d)\n",
		     name(), net()->timer().CurrentIndex());
	  */
	}
      else
	{
	  if(fPrevTA < 0)
	    {
	      /* first alarm: let's check it */
	      fPrevTA = net()->timer().CurrentTime();
	      d.data()[0] = 0;
	      /*
	      NaPrintLog("'%s' -> first alarm (at %d)\n",
			 name(), net()->timer().CurrentIndex());
	      */
	    }
	  else if(net()->timer().CurrentTime() - fPrevTA <= fATAD)
	    {
	      /* second alarm: fits average time of alarm delay */
	      fPrevTA = -1.0;
	      d.data()[0] = 1;
	      /*
	      NaPrintLog("'%s' -> second alarm (at %d) -> YES\n",
			 name(), net()->timer().CurrentIndex());
	      */
	    }
	  else if(net()->timer().CurrentTime() - fPrevTA > fATAD)
	    {
	      /* second alarm: out of average time of alarm delay */
	      fPrevTA = net()->timer().CurrentTime();
	      d.data()[0] = 0;
	      /*
	      NaPrintLog("'%s' -> second alarm (at %d) -> NO\n",
			 name(), net()->timer().CurrentIndex());
	      */
	    }
	}
      /* reset sum to initial one */
      fS = 0.0;

      /* show imaging point as threshold value */
      sum.data()[0]  = fTopVal;
    }
  else
    d.data()[0] = 0;
}